

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O1

void FFSconvert_record(IOConversionPtr conv,void *src,void *dest,void *final_string_base,
                      void *src_string_base)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uint *puVar4;
  void *pvVar5;
  ulong uVar6;
  run_time_conv_status rtcs;
  conv_status local_88;
  
  pvVar5 = src_string_base;
  if (src_string_base == (void *)0x0) {
    pvVar5 = final_string_base;
  }
  if (conv->conv_func == (conv_routine)0x0) {
    local_88.src_offset_adjust = -conv->string_offset_size;
    local_88.cur_offset = 0;
    local_88.control_value = (size_t *)0x0;
    local_88.target_pointer_size = conv->target_pointer_size;
    local_88.src_pointer_size = conv->ioformat->body->pointer_size;
    local_88.src_pointer_base = pvVar5;
    local_88.dest_pointer_base = final_string_base;
    local_88.dest_offset_adjust = local_88.src_offset_adjust;
    local_88.global_conv = conv;
    internal_convert_record(conv,&local_88,src,dest,(int)src_string_base);
  }
  else {
    if (_debug_code_generation != 0) {
      pvVar3 = (void *)((long)pvVar5 + 3);
      if (-1 < (long)pvVar5) {
        pvVar3 = pvVar5;
      }
      printf("record of type \"%s\", contents :\n",conv->ioformat->body->format_name);
      uVar1 = conv->ioformat->body->record_length;
      uVar2 = 0x1e;
      if (uVar1 < 0x78) {
        uVar2 = uVar1 >> 2;
      }
      if (uVar2 != 0) {
        uVar6 = 0;
        puVar4 = (uint *)src;
        do {
          printf("%p: %8x %8x %8x %8x\n",puVar4,(ulong)*puVar4,(ulong)puVar4[1],(ulong)puVar4[2],
                 (ulong)puVar4[3]);
          uVar6 = uVar6 + 4;
          puVar4 = puVar4 + 4;
        } while (uVar6 < uVar2);
      }
      if (pvVar5 != (void *)0x0) {
        puVar4 = (uint *)((ulong)pvVar3 & 0xfffffffffffffffc);
        puts("string contents :");
        uVar6 = 0xfffffffffffffffc;
        do {
          printf("%p: %8x %8x %8x %8x\n",puVar4,(ulong)*puVar4,(ulong)puVar4[1],(ulong)puVar4[2],
                 (ulong)puVar4[3]);
          uVar6 = uVar6 + 4;
          puVar4 = puVar4 + 4;
        } while (uVar6 < 6);
      }
    }
    local_88.src_pointer_base = (void *)-conv->string_offset_size;
    local_88.src = pvVar5;
    local_88.dest = final_string_base;
    (*conv->conv_func)(src,dest,&local_88);
  }
  return;
}

Assistant:

void
FFSconvert_record(IOConversionPtr conv, void *src, void *dest, void *final_string_base, void *src_string_base)
{
    struct conv_status cs;
    if (src_string_base == NULL) {
	src_string_base = final_string_base;
    }
    if (conv->conv_func) {
	struct run_time_conv_status rtcs;
	if (debug_code_generation()) {
	    int i;
	    int limit = 30;
	    int *tmp = (int *) (((char *) src_string_base) -
				(((intptr_t) src_string_base) % 4));
	    printf("record of type \"%s\", contents :\n", 
		   conv->ioformat->body->format_name);
	    if (limit * sizeof(int) > conv->ioformat->body->record_length)
		limit = conv->ioformat->body->record_length / sizeof(int);
	    for (i = 0; i < limit; i += 4) {
		printf("%p: %8x %8x %8x %8x\n", ((char *) src) + (i * 4),
		       ((int *) src)[i], ((int *) src)[i + 1],
		       ((int *) src)[i + 2], ((int *) src)[i + 3]);
	    }
	    if (src_string_base != NULL) {
		printf("string contents :\n");
		limit = 10;
/*		if (conv->ioformat->body->variant) {
		    FILE_INT record_len;
		    int len_align_pad = (4 - conv->ioformat->body->server_ID.length) & 3;
		    FILE_INT *len_ptr = (FILE_INT *) (src + conv->ioformat->body->server_ID.length +
						      len_align_pad);
		    memcpy(&record_len, len_ptr, sizeof(FILE_INT));
		    if (conv->ioformat->body->byte_reversal)
			byte_swap((char *) &record_len, 4);
		    record_len -= conv->ioformat->body->record_length;
		    if (limit * sizeof(int) > record_len) {
			limit = record_len / sizeof(int);
		    }
		}
*/		for (i = 0; i < limit; i += 4) {
		    printf("%p: %8x %8x %8x %8x\n", ((char *) tmp) + (i * 4),
			   ((int *) tmp)[i],
			   ((int *) tmp)[i + 1],
			   ((int *) tmp)[i + 2],
			   ((int *) tmp)[i + 3]);
		}
	    }
	}
	rtcs.src_pointer_base = src_string_base;
	rtcs.dest_pointer_base = final_string_base;
	rtcs.dest_offset_adjust = -(ssize_t) conv->string_offset_size;
	conv->conv_func(src, dest, &rtcs);
	return;
    } else {
	cs.src_pointer_base = src_string_base;
	cs.dest_pointer_base = final_string_base;
	cs.src_offset_adjust = -(ssize_t)conv->string_offset_size;
	cs.dest_offset_adjust = -(ssize_t)conv->string_offset_size;
	cs.cur_offset = 0;
	cs.control_value = NULL;
	cs.target_pointer_size = conv->target_pointer_size;
	cs.src_pointer_size = conv->ioformat->body->pointer_size;
	cs.global_conv = conv;
	internal_convert_record(conv, &cs, src, dest, 1);
    }
}